

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontendTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e7fc::BuildSystemFrontendTest::SetUp(BuildSystemFrontendTest *this)

{
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  BuildSystemFrontendTest *local_10;
  BuildSystemFrontendTest *this_local;
  
  local_10 = this;
  llbuild::TmpDir::str_abi_cxx11_(&local_30,&this->tempDir);
  std::__cxx11::string::operator=((string *)&(this->invocation).chdirPath,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  llbuild::TmpDir::str_abi_cxx11_(&local_70,&this->tempDir);
  std::operator+(&local_50,&local_70,"/trace.log");
  std::__cxx11::string::operator=((string *)&(this->invocation).traceFilePath,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

virtual void SetUp() override {
    invocation.chdirPath = tempDir.str();
    invocation.traceFilePath = tempDir.str() + "/trace.log";
  }